

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamANCF_3333::CalcCombinedCoordMatrix
          (ChElementBeamANCF_3333 *this,MatrixNx6 *ebar_ebardot)

{
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> local_70;
  Block<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false> local_60;
  
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((((this->m_nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->super_ChNodeFEAxyzD + 0x20);
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_outerStride = 6;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false>,_0>.m_data =
       (PointerType)ebar_ebardot;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,9,6,1,9,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_9,_6,_1,_9,_6>_>).m_storage.m_data
       .array + 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((((this->m_nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->super_ChNodeFEAxyzD + 0x38);
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_startCol.m_value
       = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_outerStride = 6;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,9,6,1,9,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((((this->m_nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->super_ChNodeFEAxyzD + 0xf0);
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_9,_6,_1,_9,_6>_>).m_storage.m_data
       .array + 6;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_outerStride = 6;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,9,6,1,9,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((((this->m_nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->super_ChNodeFEAxyzD + 0x108);
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_9,_6,_1,_9,_6>_>).m_storage.m_data
       .array + 9;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_startCol.m_value
       = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_outerStride = 6;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,9,6,1,9,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((((this->m_nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->super_ChNodeFEAxyzD + 0x140);
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_9,_6,_1,_9,_6>_>).m_storage.m_data
       .array + 0xc;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_outerStride = 6;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,9,6,1,9,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (((((this->m_nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
           DD_dt).m_data;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_9,_6,_1,_9,_6>_>).m_storage.m_data
       .array + 0xf;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_startCol.m_value
       = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_outerStride = 6;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,9,6,1,9,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_9,_6,_1,_9,_6>_>).m_storage.m_data
       .array + 0x12;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_startRow.m_value
       = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_outerStride = 6;
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x20);
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,9,6,1,9,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_9,_6,_1,_9,_6>_>).m_storage.m_data
       .array + 0x15;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_startRow.m_value
       = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_startCol.m_value
       = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_outerStride = 6;
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x38);
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,9,6,1,9,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0xf0);
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_9,_6,_1,_9,_6>_>).m_storage.m_data
       .array + 0x18;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_startRow.m_value
       = 4;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_outerStride = 6;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,9,6,1,9,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x108);
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_9,_6,_1,_9,_6>_>).m_storage.m_data
       .array + 0x1b;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_startRow.m_value
       = 4;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_startCol.m_value
       = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_outerStride = 6;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,9,6,1,9,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x140);
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_9,_6,_1,_9,_6>_>).m_storage.m_data
       .array + 0x1e;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_startRow.m_value
       = 5;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_outerStride = 6;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,9,6,1,9,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (((this->m_nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           DD_dt).m_data;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_9,_6,_1,_9,_6>_>).m_storage.m_data
       .array + 0x21;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_startRow.m_value
       = 5;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_startCol.m_value
       = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_outerStride = 6;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,9,6,1,9,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_9,_6,_1,_9,_6>_>).m_storage.m_data
       .array + 0x24;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_startRow.m_value
       = 6;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_outerStride = 6;
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[2].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x20);
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,9,6,1,9,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_9,_6,_1,_9,_6>_>).m_storage.m_data
       .array + 0x27;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_startRow.m_value
       = 6;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_startCol.m_value
       = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_outerStride = 6;
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[2].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x38);
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,9,6,1,9,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[2].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0xf0);
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_9,_6,_1,_9,_6>_>).m_storage.m_data
       .array + 0x2a;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_startRow.m_value
       = 7;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_outerStride = 6;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,9,6,1,9,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[2].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x108);
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_9,_6,_1,_9,_6>_>).m_storage.m_data
       .array + 0x2d;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_startRow.m_value
       = 7;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_startCol.m_value
       = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_outerStride = 6;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,9,6,1,9,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[2].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x140);
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_9,_6,_1,_9,_6>_>).m_storage.m_data
       .array + 0x30;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_startRow.m_value
       = 8;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_outerStride = 6;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,9,6,1,9,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (((this->m_nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
             ._M_impl.super__Vector_impl_data._M_start[2].
             super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           DD_dt).m_data;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_9,_6,_1,_9,_6>_>).m_storage.m_data
       .array + 0x33;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_startRow.m_value
       = 8;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_startCol.m_value
       = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_outerStride = 6;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,9,6,1,9,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  return;
}

Assistant:

void ChElementBeamANCF_3333::CalcCombinedCoordMatrix(MatrixNx6& ebar_ebardot) {
    ebar_ebardot.template block<1, 3>(0, 0) = m_nodes[0]->GetPos().eigen();
    ebar_ebardot.template block<1, 3>(0, 3) = m_nodes[0]->GetPos_dt().eigen();
    ebar_ebardot.template block<1, 3>(1, 0) = m_nodes[0]->GetD().eigen();
    ebar_ebardot.template block<1, 3>(1, 3) = m_nodes[0]->GetD_dt().eigen();
    ebar_ebardot.template block<1, 3>(2, 0) = m_nodes[0]->GetDD().eigen();
    ebar_ebardot.template block<1, 3>(2, 3) = m_nodes[0]->GetDD_dt().eigen();

    ebar_ebardot.template block<1, 3>(3, 0) = m_nodes[1]->GetPos().eigen();
    ebar_ebardot.template block<1, 3>(3, 3) = m_nodes[1]->GetPos_dt().eigen();
    ebar_ebardot.template block<1, 3>(4, 0) = m_nodes[1]->GetD().eigen();
    ebar_ebardot.template block<1, 3>(4, 3) = m_nodes[1]->GetD_dt().eigen();
    ebar_ebardot.template block<1, 3>(5, 0) = m_nodes[1]->GetDD().eigen();
    ebar_ebardot.template block<1, 3>(5, 3) = m_nodes[1]->GetDD_dt().eigen();

    ebar_ebardot.template block<1, 3>(6, 0) = m_nodes[2]->GetPos().eigen();
    ebar_ebardot.template block<1, 3>(6, 3) = m_nodes[2]->GetPos_dt().eigen();
    ebar_ebardot.template block<1, 3>(7, 0) = m_nodes[2]->GetD().eigen();
    ebar_ebardot.template block<1, 3>(7, 3) = m_nodes[2]->GetD_dt().eigen();
    ebar_ebardot.template block<1, 3>(8, 0) = m_nodes[2]->GetDD().eigen();
    ebar_ebardot.template block<1, 3>(8, 3) = m_nodes[2]->GetDD_dt().eigen();
}